

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O0

void __thiscall
helics::CoreApp::CoreApp
          (CoreApp *this,CoreType ctype,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ParseOutput PVar1;
  pointer this_00;
  CoreType in_ESI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
  *in_stack_00000058;
  CoreApp *in_stack_00000060;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000068;
  helicsCLI11App *in_stack_00000070;
  CoreApp *in_stack_00000088;
  
  CLI::std::shared_ptr<helics::Core>::shared_ptr((shared_ptr<helics::Core> *)0x44a43e);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x10);
  std::__cxx11::string::string(this_01);
  generateParser(in_stack_00000088);
  this_00 = CLI::std::
            unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
            operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x44a46c);
  helicsCLI11App::setDefaultCoreType(this_00,in_ESI);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x44a484);
  PVar1 = helicsCLI11App::
          helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (in_stack_00000070,in_stack_00000068);
  if (PVar1 == OK) {
    processArgs(in_stack_00000060,in_stack_00000058);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              this_01);
  return;
}

Assistant:

CoreApp::CoreApp(CoreType ctype, std::vector<std::string> args)
{
    auto app = generateParser();
    app->setDefaultCoreType(ctype);
    if (app->helics_parse(std::move(args)) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}